

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall
tchecker::system::system_builder_t::visit(system_builder_t *this,system_declaration_t *d)

{
  bool bVar1;
  __normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>
  *p_Var2;
  reference __r;
  element_type *peVar3;
  undefined1 local_50 [8];
  shared_ptr<tchecker::parsing::declaration_t> decl;
  __normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>
  __end2;
  __normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>
  __begin2;
  range_t<__gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>,___gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>_>
  *__range2;
  system_declaration_t *d_local;
  system_builder_t *this_local;
  
  ___begin2 = parsing::system_declaration_t::declarations(d);
  p_Var2 = range_t<__gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>,___gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>_>
           ::begin((range_t<__gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>,___gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>_>
                    *)&__begin2);
  __end2._M_current = p_Var2->_M_current;
  p_Var2 = range_t<__gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>,___gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>_>
           ::end((range_t<__gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>,___gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>_>
                  *)&__begin2);
  decl.super___shared_ptr<tchecker::parsing::declaration_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2->_M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>
                                *)&decl.
                                   super___shared_ptr<tchecker::parsing::declaration_t,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
    if (!bVar1) break;
    __r = __gnu_cxx::
          __normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>
          ::operator*(&__end2);
    std::shared_ptr<tchecker::parsing::declaration_t>::
    shared_ptr<tchecker::parsing::inner_declaration_t,void>
              ((shared_ptr<tchecker::parsing::declaration_t> *)local_50,__r);
    peVar3 = std::
             __shared_ptr_access<tchecker::parsing::declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<tchecker::parsing::declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    (*peVar3->_vptr_declaration_t[2])(peVar3,this);
    std::shared_ptr<tchecker::parsing::declaration_t>::~shared_ptr
              ((shared_ptr<tchecker::parsing::declaration_t> *)local_50);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

virtual void visit(tchecker::parsing::system_declaration_t const & d)
  {
    for (std::shared_ptr<tchecker::parsing::declaration_t> const decl : d.declarations())
      decl->visit(*this);
  }